

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O3

void __thiscall wasm::Debug::AddrExprMap::AddrExprMap(AddrExprMap *this,Module *wasm)

{
  pointer puVar1;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar2;
  __node_base *p_Var3;
  __node_base *p_Var4;
  
  (this->startMap)._M_h._M_buckets = &(this->startMap)._M_h._M_single_bucket;
  (this->startMap)._M_h._M_bucket_count = 1;
  (this->startMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->startMap)._M_h._M_element_count = 0;
  (this->startMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->startMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->startMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->endMap)._M_h._M_buckets = &(this->endMap)._M_h._M_single_bucket;
  (this->endMap)._M_h._M_bucket_count = 1;
  (this->endMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->endMap)._M_h._M_element_count = 0;
  (this->endMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->endMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->endMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->delimiterMap)._M_h._M_buckets = &(this->delimiterMap)._M_h._M_single_bucket;
  (this->delimiterMap)._M_h._M_bucket_count = 1;
  (this->delimiterMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->delimiterMap)._M_h._M_element_count = 0;
  (this->delimiterMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->delimiterMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->delimiterMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (wasm->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    p_Var3 = (__node_base *)
             ((long)&(((puVar2->_M_t).
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->
                     expressionLocations)._M_h + 0x10);
    while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
      add(this,*(Expression **)(p_Var3 + 1),*(Span *)(p_Var3 + 2));
    }
    p_Var4 = (__node_base *)
             ((long)&(((puVar2->_M_t).
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->
                     delimiterLocations)._M_h + 0x10);
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      add(this,*(Expression **)(p_Var4 + 1),(DelimiterLocations *)(p_Var4 + 2));
    }
  }
  return;
}

Assistant:

AddrExprMap(const Module& wasm) {
    for (auto& func : wasm.functions) {
      for (auto& [expr, span] : func->expressionLocations) {
        add(expr, span);
      }
      for (auto& [expr, delim] : func->delimiterLocations) {
        add(expr, delim);
      }
    }
  }